

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask11_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = *in;
  *out = uVar2;
  uVar2 = in[1] << 0xb | uVar2;
  *out = uVar2;
  uVar1 = in[2];
  *out = uVar1 << 0x16 | uVar2;
  uVar1 = uVar1 >> 10;
  out[1] = uVar1;
  uVar1 = in[3] * 2 | uVar1;
  out[1] = uVar1;
  uVar1 = in[4] << 0xc | uVar1;
  out[1] = uVar1;
  uVar2 = in[5];
  out[1] = uVar2 << 0x17 | uVar1;
  uVar2 = uVar2 >> 9;
  out[2] = uVar2;
  uVar2 = in[6] << 2 | uVar2;
  out[2] = uVar2;
  uVar2 = in[7] << 0xd | uVar2;
  out[2] = uVar2;
  uVar1 = in[8];
  out[2] = uVar1 << 0x18 | uVar2;
  uVar1 = uVar1 >> 8;
  out[3] = uVar1;
  uVar1 = in[9] << 3 | uVar1;
  out[3] = uVar1;
  uVar1 = in[10] << 0xe | uVar1;
  out[3] = uVar1;
  uVar2 = in[0xb];
  out[3] = uVar2 << 0x19 | uVar1;
  uVar2 = uVar2 >> 7;
  out[4] = uVar2;
  uVar2 = in[0xc] << 4 | uVar2;
  out[4] = uVar2;
  uVar2 = in[0xd] << 0xf | uVar2;
  out[4] = uVar2;
  uVar1 = in[0xe];
  out[4] = uVar1 << 0x1a | uVar2;
  uVar1 = uVar1 >> 6;
  out[5] = uVar1;
  out[5] = in[0xf] << 5 | uVar1;
  return out + 6;
}

Assistant:

uint32_t *__fastpackwithoutmask11_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (11 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (11 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (11 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (11 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (11 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;

  return out + 1;
}